

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseValueTypeList(WastParser *this,TypeVector *out_type_list)

{
  bool bVar1;
  Token local_88;
  Type local_34;
  
  while( true ) {
    bVar1 = PeekMatch(this,First_Type);
    if (!bVar1) break;
    Consume(&local_88,this);
    local_34 = Token::type(&local_88);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
              (out_type_list,&local_34);
    Token::~Token(&local_88);
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseValueTypeList(TypeVector* out_type_list) {
  WABT_TRACE(ParseValueTypeList);
  while (PeekMatch(TokenType::ValueType))
    out_type_list->push_back(Consume().type());

  return Result::Ok;
}